

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondR.cpp
# Opt level: O0

void __thiscall
OpenMD::HBondR::HBondR
          (HBondR *this,SimInfo *info,string *filename,string *sele1,string *sele2,string *sele3,
          double rCut,RealType len,double thetaCut,int nrbins)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  ForceField *pFVar4;
  string *in_RCX;
  undefined8 *in_RDI;
  string *in_R8;
  string *in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined4 in_stack_00000008;
  SimInfo *in_stack_000000d8;
  SelectionManager *in_stack_000000e0;
  undefined4 in_stack_fffffffffffffe28;
  uint in_stack_fffffffffffffe2c;
  string *in_stack_fffffffffffffe30;
  StaticAnalyser *this_00;
  SimInfo *in_stack_fffffffffffffe38;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe68;
  string *script;
  SelectionEvaluator *this_01;
  string local_110 [32];
  string local_f0 [24];
  SimInfo *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  
  StaticAnalyser::StaticAnalyser
            ((StaticAnalyser *)in_stack_fffffffffffffe40._M_current,in_stack_fffffffffffffe38,
             in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
  *in_RDI = &PTR__HBondR_0055f3f0;
  std::__cxx11::string::string((string *)(in_RDI + 0x1a),in_RCX);
  SelectionManager::SelectionManager(in_stack_000000e0,in_stack_000000d8);
  SelectionEvaluator::SelectionEvaluator
            ((SelectionEvaluator *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28);
  std::__cxx11::string::string((string *)(in_RDI + 0xe1),in_R8);
  SelectionManager::SelectionManager(in_stack_000000e0,in_stack_000000d8);
  SelectionEvaluator::SelectionEvaluator
            ((SelectionEvaluator *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28);
  std::__cxx11::string::string((string *)(in_RDI + 0x1a8),in_R9);
  SelectionManager::SelectionManager(in_stack_000000e0,in_stack_000000d8);
  SelectionEvaluator::SelectionEvaluator
            ((SelectionEvaluator *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28);
  in_RDI[0x270] = in_XMM1_Qa;
  *(undefined4 *)((long)in_RDI + 0x13a4) = in_stack_00000008;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x16d849);
  script = (string *)(in_RDI + 0x278);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16d862);
  this_01 = (SelectionEvaluator *)(in_RDI + 0x27b);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16d87b);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16d894);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16d8ad);
  pFVar4 = SimInfo::getForceField((SimInfo *)in_RDI[1]);
  in_RDI[0x26f] = pFVar4;
  SelectionEvaluator::loadScriptString(this_01,script);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x37));
  if (!(bool)uVar1) {
    SelectionEvaluator::evaluate((SelectionEvaluator *)CONCAT17(uVar1,in_stack_fffffffffffffe68));
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffe40._M_current,
               (SelectionSet *)in_stack_fffffffffffffe38);
    SelectionSet::~SelectionSet((SelectionSet *)0x16d964);
  }
  SelectionEvaluator::loadScriptString(this_01,script);
  bVar2 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xfe));
  if (!bVar2) {
    in_stack_fffffffffffffe50 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0xe5);
    SelectionEvaluator::evaluate((SelectionEvaluator *)CONCAT17(uVar1,in_stack_fffffffffffffe68));
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffe40._M_current,
               (SelectionSet *)in_stack_fffffffffffffe38);
    SelectionSet::~SelectionSet((SelectionSet *)0x16db18);
  }
  SelectionEvaluator::loadScriptString(this_01,script);
  uVar3 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1c5));
  if (!(bool)uVar3) {
    in_stack_fffffffffffffe40._M_current = (double *)(in_RDI + 0x1ac);
    SelectionEvaluator::evaluate((SelectionEvaluator *)CONCAT17(uVar1,in_stack_fffffffffffffe68));
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffe40._M_current,
               (SelectionSet *)in_stack_fffffffffffffe38);
    SelectionSet::~SelectionSet((SelectionSet *)0x16dbcf);
  }
  in_RDI[0x271] = in_XMM0_Qa;
  in_RDI[0x273] = in_XMM2_Qa;
  in_RDI[0x272] = (double)in_RDI[0x270] / (double)*(int *)((long)in_RDI + 0x13a4);
  *(undefined4 *)((long)in_RDI + 0x13a4) = in_stack_00000008;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe50,
             CONCAT17(uVar3,in_stack_fffffffffffffe48));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe50,
             CONCAT17(uVar3,in_stack_fffffffffffffe48));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe50,
             CONCAT17(uVar3,in_stack_fffffffffffffe48));
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffe50,CONCAT17(uVar3,in_stack_fffffffffffffe48));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe50,
             CONCAT17(uVar3,in_stack_fffffffffffffe48));
  __last._M_current = (double *)(in_RDI + 0x275);
  std::vector<double,_std::allocator<double>_>::begin
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (in_stack_fffffffffffffe40,__last,(double *)in_stack_fffffffffffffe30);
  this_00 = (StaticAnalyser *)(in_RDI + 0x278);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             in_stack_fffffffffffffe40._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current,
             (int *)this_00);
  getPrefix((string *)__last._M_current);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __last._M_current,(char *)this_00);
  StaticAnalyser::setOutputName
            (this_00,(string *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_110);
  return;
}

Assistant:

HBondR::HBondR(SimInfo* info, const std::string& filename,
                 const std::string& sele1, const std::string& sele2,
                 const std::string& sele3, double rCut, RealType len,
                 double thetaCut, int nrbins) :
      StaticAnalyser(info, filename, nrbins),
      selectionScript1_(sele1), seleMan1_(info), evaluator1_(info),
      selectionScript2_(sele2), seleMan2_(info), evaluator2_(info),
      selectionScript3_(sele3), seleMan3_(info), evaluator3_(info), len_(len),
      nBins_(nrbins) {
    ff_ = info_->getForceField();

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }
    evaluator2_.loadScriptString(sele2);
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }
    evaluator3_.loadScriptString(sele3);
    if (!evaluator3_.isDynamic()) {
      seleMan3_.setSelectionSet(evaluator3_.evaluate());
    }

    // Set up cutoff values:

    rCut_     = rCut;
    thetaCut_ = thetaCut;
    deltaR_   = len_ / nBins_;
    nBins_    = nrbins;
    // fixed number of bins

    nHBonds_.resize(nBins_);
    nDonor_.resize(nBins_);
    nAcceptor_.resize(nBins_);
    sliceQ_.resize(nBins_);
    sliceCount_.resize(nBins_);
    std::fill(sliceQ_.begin(), sliceQ_.end(), 0.0);
    std::fill(sliceCount_.begin(), sliceCount_.end(), 0);

    setOutputName(getPrefix(filename) + ".hbondr");
  }